

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makecrct.c
# Opt level: O2

void write_table32hi(z_word_t *table,int k)

{
  char cVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  
  lVar5 = 0;
  do {
    if (lVar5 == 0) {
      uVar3 = *table;
      pcVar4 = "";
LAB_0010174a:
      pcVar2 = ", ";
    }
    else {
      if (lVar5 == 0x100) {
        return;
      }
      cVar1 = (char)(((ushort)lVar5 & 0xff) / 5) * -5;
      pcVar4 = "    ";
      if ((char)(cVar1 + (char)lVar5) != '\0') {
        pcVar4 = "";
      }
      uVar3 = table[lVar5];
      if (lVar5 == 0xff) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ",\n";
        if ((char)(cVar1 + (char)lVar5) != '\x04') goto LAB_0010174a;
      }
    }
    printf("%s0x%08x%s",pcVar4,uVar3 >> 0x20,pcVar2);
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

static void write_table32hi(const z_word_t *table, int k) {
    int n;

    for (n = 0; n < k; n++)
        printf("%s0x%08" PRIx32 "%s", n == 0 || n % 5 ? "" : "    ",
                (uint32_t)(table[n] >> 32),
                n == k - 1 ? "" : (n % 5 == 4 ? ",\n" : ", "));
}